

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

PixelBufferAccess * __thiscall
glu::TextureBuffer::getFullRefTexture(PixelBufferAccess *__return_storage_ptr__,TextureBuffer *this)

{
  int iVar1;
  size_t sVar2;
  TextureFormat format;
  TextureFormat local_38;
  IVec3 local_2c;
  
  local_38 = mapGLInternalFormat(this->m_format);
  sVar2 = this->m_size;
  if (sVar2 == 0) {
    sVar2 = (size_t)(uint)(this->m_refBuffer).m_cap;
  }
  iVar1 = tcu::TextureFormat::getPixelSize(&local_38);
  local_2c.m_data[0] =
       (int)((long)((ulong)(uint)((int)sVar2 >> 0x1f) << 0x20 | sVar2 & 0xffffffff) / (long)iVar1);
  local_2c.m_data[1] = 1;
  local_2c.m_data[2] = 1;
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&local_38,&local_2c,
             (void *)((long)(this->m_refBuffer).m_ptr + this->m_offset));
  return __return_storage_ptr__;
}

Assistant:

const tcu::PixelBufferAccess TextureBuffer::getFullRefTexture (void)
{
	const tcu::TextureFormat	format				= mapGLInternalFormat(m_format);
	const size_t				bufferLengthBytes	= (m_size != 0) ? (m_size) : (m_refBuffer.size());
	const int					bufferLengthPixels	= (int)bufferLengthBytes / format.getPixelSize();

	return tcu::PixelBufferAccess(format,
								  tcu::IVec3(bufferLengthPixels, 1, 1),
								  (deUint8*)m_refBuffer.getPtr() + m_offset);
}